

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O2

int CfdSignSchnorr(void *handle,char *msg,char *sk,char *aux_rand,char **signature)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  string *this;
  allocator local_133;
  allocator local_132;
  allocator local_131;
  SchnorrSignature schnorr_sig;
  SchnorrSignature local_108;
  string local_e0;
  string local_c0;
  Privkey local_a0;
  string local_80;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(msg);
  if (bVar1) {
    schnorr_sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
    schnorr_sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x26c;
    schnorr_sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdSignSchnorr";
    cfd::core::logger::warn<>((CfdSourceLocation *)&schnorr_sig,"msg is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&schnorr_sig,"Failed to parameter. msg is null or empty.",
               (allocator *)&local_108);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&schnorr_sig);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(sk);
  if (!bVar1) {
    if (signature != (char **)0x0) {
      cfd::core::SchnorrSignature::SchnorrSignature(&schnorr_sig);
      bVar1 = cfd::capi::IsEmptyString(aux_rand);
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_80,msg,(allocator *)&local_48);
        cfd::core::ByteData256::ByteData256((ByteData256 *)&local_e0,&local_80);
        std::__cxx11::string::string((string *)&local_c0,sk,(allocator *)&local_60);
        cfd::core::Privkey::Privkey(&local_a0,&local_c0,kMainnet,true);
        cfd::core::SchnorrUtil::Sign(&local_108,(ByteData256 *)&local_e0,&local_a0);
        cfd::core::SchnorrSignature::operator=(&schnorr_sig,&local_108);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_108);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a0);
        std::__cxx11::string::~string((string *)&local_c0);
        this = &local_e0;
      }
      else {
        std::__cxx11::string::string((string *)&local_80,msg,&local_131);
        cfd::core::ByteData256::ByteData256((ByteData256 *)&local_48,&local_80);
        std::__cxx11::string::string((string *)&local_c0,sk,&local_132);
        cfd::core::Privkey::Privkey(&local_a0,&local_c0,kMainnet,true);
        std::__cxx11::string::string((string *)&local_e0,aux_rand,&local_133);
        cfd::core::ByteData256::ByteData256((ByteData256 *)&local_60,&local_e0);
        cfd::core::SchnorrUtil::Sign
                  (&local_108,(ByteData256 *)&local_48,&local_a0,(ByteData256 *)&local_60);
        cfd::core::SchnorrSignature::operator=(&schnorr_sig,&local_108);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_108);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
        std::__cxx11::string::~string((string *)&local_e0);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a0);
        std::__cxx11::string::~string((string *)&local_c0);
        this = (string *)&local_48;
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)this);
      std::__cxx11::string::~string((string *)&local_80);
      cfd::core::SchnorrSignature::GetHex_abi_cxx11_((string *)&local_108,&schnorr_sig,false);
      pcVar2 = cfd::capi::CreateString((string *)&local_108);
      *signature = pcVar2;
      std::__cxx11::string::~string((string *)&local_108);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_sig);
      return 0;
    }
    schnorr_sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
    schnorr_sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x278;
    schnorr_sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdSignSchnorr";
    cfd::core::logger::warn<>((CfdSourceLocation *)&schnorr_sig,"signature is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&schnorr_sig,"Failed to parameter. signature is null.",
               (allocator *)&local_108);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&schnorr_sig);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  schnorr_sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
  schnorr_sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0x272;
  schnorr_sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = "CfdSignSchnorr";
  cfd::core::logger::warn<>((CfdSourceLocation *)&schnorr_sig,"sk is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&schnorr_sig,"Failed to parameter. sk is null or empty.",
             (allocator *)&local_108);
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&schnorr_sig);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdSignSchnorr(
    void* handle, const char* msg, const char* sk, const char* aux_rand,
    char** signature) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(msg)) {
      warn(CFD_LOG_SOURCE, "msg is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. msg is null or empty.");
    }
    if (IsEmptyString(sk)) {
      warn(CFD_LOG_SOURCE, "sk is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. sk is null or empty.");
    }
    if (signature == nullptr) {
      warn(CFD_LOG_SOURCE, "signature is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null.");
    }

    SchnorrSignature schnorr_sig;
    if (IsEmptyString(aux_rand)) {
      schnorr_sig = SchnorrUtil::Sign(ByteData256(msg), Privkey(sk));
    } else {
      schnorr_sig = SchnorrUtil::Sign(
          ByteData256(msg), Privkey(sk), ByteData256(aux_rand));
    }

    *signature = CreateString(schnorr_sig.GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}